

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O2

ChShaftsElasticGear * __thiscall chrono::ChShaftsElasticGear::Clone(ChShaftsElasticGear *this)

{
  ChShaftsElasticGear *this_00;
  
  this_00 = (ChShaftsElasticGear *)::operator_new(0x98);
  ChShaftsElasticGear(this_00,this);
  return this_00;
}

Assistant:

virtual ChShaftsElasticGear* Clone() const override { return new ChShaftsElasticGear(*this); }